

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot.cpp
# Opt level: O2

void ImPlot::PushColormap(ImPlotColormap colormap)

{
  ImPlotContext *pIVar1;
  
  pIVar1 = GImPlot;
  if ((-1 < colormap) && (colormap < (GImPlot->ColormapData).Count)) {
    ImVector<int>::push_back(&GImPlot->ColormapModifiers,&(GImPlot->Style).Colormap);
    (pIVar1->Style).Colormap = colormap;
    return;
  }
  __assert_fail("(colormap >= 0 && colormap < gp.ColormapData.Count) && \"The colormap index is invalid!\""
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/implot.cpp"
                ,0xd18,"void ImPlot::PushColormap(ImPlotColormap)");
}

Assistant:

void PushColormap(ImPlotColormap colormap) {
    ImPlotContext& gp = *GImPlot;
    IM_ASSERT_USER_ERROR(colormap >= 0 && colormap < gp.ColormapData.Count, "The colormap index is invalid!");
    gp.ColormapModifiers.push_back(gp.Style.Colormap);
    gp.Style.Colormap = colormap;
}